

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_chain_maximal_simplex_removal<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>
               (Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>
                *m)

{
  Index IVar1;
  _List_node_base *p_Var2;
  pointer puVar3;
  pointer pvVar4;
  undefined1 local_16c [4];
  int *local_168;
  _List_node_base **local_160;
  int local_154;
  undefined **local_150;
  undefined1 local_148;
  undefined8 *local_140;
  _List_node_base ***local_138;
  undefined1 local_130;
  undefined8 local_128;
  shared_count sStack_120;
  undefined **local_118;
  undefined1 local_110;
  undefined8 *local_108;
  int **local_100;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>>
            ();
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>
            (&columns,m);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x388);
  local_16c = SUB84((m->matrix_).matrix_._M_h._M_element_count,0);
  local_160 = (_List_node_base **)local_16c;
  local_168 = &local_154;
  local_154 = 7;
  local_130 = local_16c == (undefined1  [4])0x7;
  local_128 = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_138 = &local_160;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_00230078;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_100 = &local_168;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_002300f0;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_120);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x38a);
  p_Var2 = *(_List_node_base **)
            ((long)&(m->matrix_).super_Chain_pairing_option.barcode_.
                    super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                    ._M_impl._M_node.super__List_node_base + 8);
  local_16c = (undefined1  [4])0x6;
  local_130 = *(int *)&p_Var2[1]._M_prev == 6;
  local_160 = &p_Var2[1]._M_prev;
  local_128 = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_148 = 0;
  local_110 = 0;
  local_150 = &PTR__lazy_ostream_00230078;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = &local_160;
  local_168 = (int *)local_16c;
  local_118 = &PTR__lazy_ostream_002300f0;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = &local_168;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_120);
  IVar1 = (m->matrix_).nextIndex_;
  if ((IVar1 != 0) && ((m->matrix_).matrix_._M_h._M_element_count != 0)) {
    Gudhi::persistence_matrix::
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
    ::_remove_last(&m->matrix_,IVar1 - 1);
  }
  puVar3 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar3 != (pointer)0x0) {
    pvVar4 = columns.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         columns.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar3,(long)(pvVar4->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
    pvVar4 = columns.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  columns.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>
            (&columns,m);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x396);
  local_16c = SUB84((m->matrix_).matrix_._M_h._M_element_count,0);
  local_130 = local_16c == (undefined1  [4])0x6;
  local_168 = &local_154;
  local_154 = 6;
  local_148 = 0;
  local_110 = 0;
  local_128 = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_118 = &PTR__lazy_ostream_002300f0;
  local_160 = (_List_node_base **)local_16c;
  local_150 = &PTR__lazy_ostream_00230078;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = &local_160;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = &local_168;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_120);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x399);
  p_Var2 = *(_List_node_base **)
            ((long)&(m->matrix_).super_Chain_pairing_option.barcode_.
                    super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                    ._M_impl._M_node.super__List_node_base + 8);
  local_16c = (undefined1  [4])0xffffffff;
  local_130 = *(int *)&p_Var2[1]._M_prev == -1;
  local_160 = &p_Var2[1]._M_prev;
  local_128 = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_00230078;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = &local_160;
  local_168 = (int *)local_16c;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_00230078;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = &local_168;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_120);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_chain_maximal_simplex_removal(Matrix& m) {
  auto columns = build_simple_chain_matrix<typename Matrix::Column>();

  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  if constexpr (Matrix::Option_list::has_column_pairings) {
    BOOST_CHECK_EQUAL(m.get_current_barcode().back().death, 6);
  }

  if constexpr (Matrix::Option_list::has_vine_update && Matrix::Option_list::has_map_column_container &&
                Matrix::Option_list::has_column_pairings) {
    m.remove_maximal_cell(6);
  } else {
    m.remove_last();
  }

  columns.pop_back();
  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  if constexpr (Matrix::Option_list::has_column_pairings) {
    BOOST_CHECK_EQUAL(m.get_current_barcode().back().death,
                      Matrix::template get_null_value<typename Matrix::ID_index>());
  }
}